

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::ColorVerifier::ColorVerifier
          (ColorVerifier *this,Vec3 *_color,int _threshold)

{
  Vec4 local_18;
  
  (this->super_Verifier)._vptr_Verifier = (_func_int **)&PTR_verify_00a0bfc0;
  local_18.m_data[2] = _color->m_data[2];
  local_18.m_data._0_8_ = *(undefined8 *)_color->m_data;
  local_18.m_data[3] = 1.0;
  tcu::RGBA::RGBA(&this->m_color,&local_18);
  tcu::Vector<int,_3>::Vector(&this->m_threshold,8);
  return;
}

Assistant:

ColorVerifier (const tcu::Vec3& _color, int _threshold = 8)
		: m_color		(tcu::Vec4(_color.x(), _color.y(), _color.z(), 1.0f))
		, m_threshold	(tcu::IVec3(_threshold))
	{
	}